

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool exists_file(char *name)

{
  int __fd;
  
  __fd = open(name,0);
  if (0 < __fd) {
    close(__fd);
  }
  return 0 < __fd;
}

Assistant:

bool exists_file(const char *name)
{
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	char16_t temp[MAX_PATH];
	char16_t *res = u8tou16_path(name, temp);
	if (res == NULL)
	{
		return false;
	}
	if (PathFileExistsW(temp) == false)
	{
		return false;
	}
	return !PathIsDirectoryW(temp);
#elif defined(__MINGW32__)
	char temp2[MAX_PATH];
	char *res = u8tosjis_path(name, temp2);
	if (res == NULL)
	{
		return false;
	}
	int fd = open(temp2, O_RDONLY);
	if (fd <= 0)
	{
		return false;
	}
	close(fd);
	if (fd <= 0)
	{
		return false;
	}
	return true;
#else
	int fd = open(name, O_RDONLY);
	if (fd <= 0)
	{
		return false;
	}
	close(fd);
	if (fd <= 0)
	{
		return false;
	}
	return true;
#endif
}